

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Group * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
          (Arena *this,Union *params)

{
  Group *ptr;
  
  ptr = (Group *)allocateBytes(this,0x38,8,true);
  (ptr->super_StructOrGroup)._vptr_StructOrGroup = (_func_int **)&PTR_addVoid_006d5530;
  ptr->parent = params;
  (ptr->parentDataLocationUsage).builder.ptr = (DataLocationUsage *)0x0;
  (ptr->parentDataLocationUsage).builder.pos =
       (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *)0x0;
  (ptr->parentDataLocationUsage).builder.endPtr = (DataLocationUsage *)0x0;
  (ptr->parentDataLocationUsage).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  ptr->parentPointerLocationUsage = 0;
  ptr->hasMembers = false;
  setDestructor(this,ptr,destroyObject<capnp::compiler::NodeTranslator::StructLayout::Group>);
  return ptr;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}